

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DancingNode.cpp
# Opt level: O3

void search(int k,DancingNode *header,
           vector<s_DancingNode_*,_std::allocator<s_DancingNode_*>_> *solutions,
           vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
           *Matrix,vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *grid)

{
  pointer *pppsVar1;
  iterator __position;
  s_DancingNode *psVar2;
  DancingNode *min_col;
  DancingNode *targetDancingNode;
  s_DancingNode *local_40;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_38;
  
  targetDancingNode = header->right;
  if (targetDancingNode != header) {
    psVar2 = targetDancingNode->right;
    do {
      if (psVar2->nodeCount < targetDancingNode->nodeCount) {
        targetDancingNode = psVar2;
      }
      psVar2 = psVar2->right;
    } while (psVar2 != header);
    local_38 = grid;
    cover(targetDancingNode,Matrix);
    local_40 = targetDancingNode->down;
    if (local_40 != targetDancingNode) {
      do {
        __position._M_current =
             (solutions->super__Vector_base<s_DancingNode_*,_std::allocator<s_DancingNode_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (solutions->super__Vector_base<s_DancingNode_*,_std::allocator<s_DancingNode_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<s_DancingNode*,std::allocator<s_DancingNode*>>::
          _M_realloc_insert<s_DancingNode*const&>
                    ((vector<s_DancingNode*,std::allocator<s_DancingNode*>> *)solutions,__position,
                     &local_40);
        }
        else {
          *__position._M_current = local_40;
          pppsVar1 = &(solutions->
                      super__Vector_base<s_DancingNode_*,_std::allocator<s_DancingNode_*>_>)._M_impl
                      .super__Vector_impl_data._M_finish;
          *pppsVar1 = *pppsVar1 + 1;
        }
        psVar2 = local_40->right;
        if (psVar2 != local_40) {
          do {
            cover(psVar2,Matrix);
            psVar2 = psVar2->right;
          } while (psVar2 != local_40);
        }
        search(k + 1,header,solutions,Matrix,local_38);
        pppsVar1 = &(solutions->
                    super__Vector_base<s_DancingNode_*,_std::allocator<s_DancingNode_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppsVar1 = *pppsVar1 + -1;
        targetDancingNode = local_40->column;
        for (psVar2 = local_40->left; psVar2 != local_40; psVar2 = psVar2->left) {
          uncover(psVar2,Matrix);
        }
        local_40 = local_40->down;
      } while (local_40 != targetDancingNode);
    }
    uncover(targetDancingNode,Matrix);
    return;
  }
  printSolutions(solutions,grid);
  return;
}

Assistant:

void search(int k, DancingNode *header, vector<DancingNode*> &solutions, vector<vector<DancingNode>> &Matrix, vector<vector<int>> &grid) 
{ 
    DancingNode *rowNode; 
    DancingNode *rightNode; 
    DancingNode *leftNode; 
    DancingNode *column; 
    //cout<<"IN"<<endl; 
    // if no column left, then we must 
    // have found the solution 
    if(header->right == header) 
    {
        //cout << "OUT" << endl; 
        printSolutions(solutions, grid); 
        return; 
    } 
  
    // choose column deterministically 
    column = getMinColumn(header); 
    //cout << "COVERING" <<endl; 
    // cover chosen column 
    cover(column, Matrix); 
  
    for(rowNode = column->down; rowNode != column;  
        rowNode = rowNode->down ) 
    {
        //cout << "hey u" << endl; 
        solutions.push_back(rowNode); 
  
        for(rightNode = rowNode->right; rightNode != rowNode; 
            rightNode = rightNode->right) 
            cover(rightNode, Matrix); 
  
        // move to level k+1 (recursively) 
        search(k+1, header, solutions, Matrix, grid); 
  
        // if solution in not possible, backtrack (uncover) 
        // and remove the selected row (set) from solution 
        solutions.pop_back(); 
  
        column = rowNode->column; 
        for(leftNode = rowNode->left; leftNode != rowNode; 
            leftNode = leftNode->left) 
            uncover(leftNode, Matrix); 
    } 
  
    uncover(column, Matrix); 
}